

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_codestream_index_t * j2k_get_cstr_index(opj_j2k_v2_t *p_j2k)

{
  uint uVar1;
  uint uVar2;
  opj_codestream_index_t *poVar3;
  opj_tile_index_t *poVar4;
  void *pvVar5;
  size_t __size;
  OPJ_OFF_T OVar6;
  opj_codestream_index_t *__ptr;
  opj_marker_info_t *__ptr_00;
  opj_tile_index_t *__ptr_01;
  void *pvVar7;
  long lVar8;
  long lVar9;
  opj_marker_info_t **ppoVar10;
  
  __ptr = (opj_codestream_index_t *)calloc(1,0x38);
  if (__ptr != (opj_codestream_index_t *)0x0) {
    poVar3 = p_j2k->cstr_index;
    OVar6 = poVar3->main_head_end;
    __ptr->main_head_start = poVar3->main_head_start;
    __ptr->main_head_end = OVar6;
    __ptr->codestream_size = poVar3->codestream_size;
    uVar1 = poVar3->marknum;
    __ptr->marknum = uVar1;
    __size = (ulong)uVar1 * 0x18;
    __ptr_00 = (opj_marker_info_t *)malloc(__size);
    __ptr->marker = __ptr_00;
    if (__ptr_00 != (opj_marker_info_t *)0x0) {
      if (poVar3->marker == (opj_marker_info_t *)0x0) {
        free(__ptr_00);
        __ptr->marker = (opj_marker_info_t *)0x0;
      }
      else {
        memcpy(__ptr_00,poVar3->marker,__size);
      }
      uVar1 = poVar3->nb_of_tiles;
      __ptr->nb_of_tiles = uVar1;
      __ptr_01 = (opj_tile_index_t *)calloc((ulong)uVar1,0x38);
      __ptr->tile_index = __ptr_01;
      if (__ptr_01 != (opj_tile_index_t *)0x0) {
        if (poVar3->tile_index == (opj_tile_index_t *)0x0) {
          free(__ptr_01);
          __ptr->tile_index = (opj_tile_index_t *)0x0;
          return __ptr;
        }
        if ((ulong)uVar1 == 0) {
          return __ptr;
        }
        lVar8 = 0x18;
        lVar9 = 0;
        while( true ) {
          poVar4 = p_j2k->cstr_index->tile_index;
          uVar2 = *(uint *)((long)&poVar4->tileno + lVar8);
          *(uint *)((long)&__ptr_01->tileno + lVar8) = uVar2;
          pvVar7 = malloc((ulong)uVar2 * 0x18);
          *(void **)((long)&__ptr_01->current_nb_tps + lVar8) = pvVar7;
          if (pvVar7 == (void *)0x0) {
            if ((int)lVar9 != 0) {
              ppoVar10 = &__ptr_01->marker;
              do {
                free(*ppoVar10);
                ppoVar10 = ppoVar10 + 7;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            goto LAB_0012928b;
          }
          pvVar5 = *(void **)((long)&poVar4->current_nb_tps + lVar8);
          if (pvVar5 == (void *)0x0) {
            free(pvVar7);
            *(undefined8 *)((long)&__ptr_01->current_nb_tps + lVar8) = 0;
          }
          else {
            memcpy(pvVar7,pvVar5,(ulong)*(uint *)((long)&__ptr_01->tileno + lVar8) * 0x18);
          }
          poVar4 = p_j2k->cstr_index->tile_index;
          uVar2 = *(uint *)((long)poVar4 + lVar8 + -0x14);
          *(uint *)((long)__ptr_01 + lVar8 + -0x14) = uVar2;
          pvVar7 = malloc((ulong)uVar2 * 0x18);
          *(void **)((long)__ptr_01 + lVar8 + -8) = pvVar7;
          if (pvVar7 == (void *)0x0) break;
          pvVar5 = *(void **)((long)poVar4 + lVar8 + -8);
          if (pvVar5 == (void *)0x0) {
            free(pvVar7);
            *(undefined8 *)((long)__ptr_01 + lVar8 + -8) = 0;
          }
          else {
            memcpy(pvVar7,pvVar5,(ulong)*(uint *)((long)__ptr_01 + lVar8 + -0x14) * 0x18);
          }
          *(undefined4 *)((long)&__ptr_01->tp_index + lVar8 + 4) = 0;
          *(undefined8 *)((long)&__ptr_01->marknum + lVar8) = 0;
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x38;
          if (uVar1 == (uint)lVar9) {
            return __ptr;
          }
        }
        if ((int)lVar9 != 0) {
          ppoVar10 = &__ptr_01->marker;
          do {
            free(*ppoVar10);
            free((opj_tp_index_t *)ppoVar10[-2]);
            ppoVar10 = ppoVar10 + 7;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
LAB_0012928b:
        free(__ptr_01);
      }
      free(__ptr->marker);
    }
    free(__ptr);
  }
  return (opj_codestream_index_t *)0x0;
}

Assistant:

opj_codestream_index_t* j2k_get_cstr_index(opj_j2k_v2_t* p_j2k)
{
 	opj_codestream_index_t* l_cstr_index = (opj_codestream_index_t*)
			opj_calloc(1,sizeof(opj_codestream_index_t));
	if (!l_cstr_index)
		return NULL;

	l_cstr_index->main_head_start = p_j2k->cstr_index->main_head_start;
	l_cstr_index->main_head_end = p_j2k->cstr_index->main_head_end;
	l_cstr_index->codestream_size = p_j2k->cstr_index->codestream_size;

	l_cstr_index->marknum = p_j2k->cstr_index->marknum;
	l_cstr_index->marker = (opj_marker_info_t*)opj_malloc(l_cstr_index->marknum*sizeof(opj_marker_info_t));
	if (!l_cstr_index->marker){
		opj_free( l_cstr_index);
		return NULL;
	}

	if (p_j2k->cstr_index->marker)
		memcpy(l_cstr_index->marker, p_j2k->cstr_index->marker, l_cstr_index->marknum * sizeof(opj_marker_info_t) );
	else{
		opj_free(l_cstr_index->marker);
		l_cstr_index->marker = NULL;
	}

	l_cstr_index->nb_of_tiles = p_j2k->cstr_index->nb_of_tiles;
	l_cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(l_cstr_index->nb_of_tiles, sizeof(opj_tile_index_t) );
	if (!l_cstr_index->tile_index){
		opj_free( l_cstr_index->marker);
		opj_free( l_cstr_index);
		return NULL;
	}

	if (!p_j2k->cstr_index->tile_index){
		opj_free(l_cstr_index->tile_index);
		l_cstr_index->tile_index = NULL;
	}
	else {
		OPJ_UINT32 it_tile = 0;
		for (it_tile = 0; it_tile < l_cstr_index->nb_of_tiles; it_tile++ ){

			/* Tile Marker*/
			l_cstr_index->tile_index[it_tile].marknum = p_j2k->cstr_index->tile_index[it_tile].marknum;

			l_cstr_index->tile_index[it_tile].marker =
				(opj_marker_info_t*)opj_malloc(l_cstr_index->tile_index[it_tile].marknum*sizeof(opj_marker_info_t));

			if (!l_cstr_index->tile_index[it_tile].marker) {
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].marker)
				memcpy(	l_cstr_index->tile_index[it_tile].marker,
						p_j2k->cstr_index->tile_index[it_tile].marker,
						l_cstr_index->tile_index[it_tile].marknum * sizeof(opj_marker_info_t) );
			else{
				opj_free(l_cstr_index->tile_index[it_tile].marker);
				l_cstr_index->tile_index[it_tile].marker = NULL;
			}

			/* Tile part index*/
			l_cstr_index->tile_index[it_tile].nb_tps = p_j2k->cstr_index->tile_index[it_tile].nb_tps;

			l_cstr_index->tile_index[it_tile].tp_index =
				(opj_tp_index_t*)opj_malloc(l_cstr_index->tile_index[it_tile].nb_tps*sizeof(opj_tp_index_t));

			if(!l_cstr_index->tile_index[it_tile].tp_index){
				OPJ_UINT32 it_tile_free;

				for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
					opj_free(l_cstr_index->tile_index[it_tile_free].marker);
					opj_free(l_cstr_index->tile_index[it_tile_free].tp_index);
				}

				opj_free( l_cstr_index->tile_index);
				opj_free( l_cstr_index->marker);
				opj_free( l_cstr_index);
				return NULL;
			}

			if (p_j2k->cstr_index->tile_index[it_tile].tp_index){
				memcpy(	l_cstr_index->tile_index[it_tile].tp_index,
						p_j2k->cstr_index->tile_index[it_tile].tp_index,
						l_cstr_index->tile_index[it_tile].nb_tps * sizeof(opj_tp_index_t) );
			}
			else{
				opj_free(l_cstr_index->tile_index[it_tile].tp_index);
				l_cstr_index->tile_index[it_tile].tp_index = NULL;
			}

			/* Packet index (NOT USED)*/
			l_cstr_index->tile_index[it_tile].nb_packet = 0;
			l_cstr_index->tile_index[it_tile].packet_index = NULL;

		}
	}

	return l_cstr_index;
}